

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O3

int WriteOutput(Context *context)

{
  uint8_t *__ptr;
  int iVar1;
  size_t __n;
  int iVar2;
  
  __ptr = context->output;
  context->total_out = (size_t)(context->next_out + (context->total_out - (long)__ptr));
  iVar2 = 1;
  __n = (long)context->next_out - (long)__ptr;
  if ((__n != 0) && (context->test_integrity == 0)) {
    fwrite(__ptr,1,__n,(FILE *)context->fout);
    iVar1 = ferror((FILE *)context->fout);
    if (iVar1 != 0) {
      WriteOutput_cold_1();
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static BROTLI_BOOL WriteOutput(Context* context) {
  size_t out_size = (size_t)(context->next_out - context->output);
  context->total_out += out_size;
  if (out_size == 0) return BROTLI_TRUE;
  if (context->test_integrity) return BROTLI_TRUE;

  fwrite(context->output, 1, out_size, context->fout);
  if (ferror(context->fout)) {
    fprintf(stderr, "failed to write output [%s]: %s\n",
            PrintablePath(context->current_output_path), strerror(errno));
    return BROTLI_FALSE;
  }
  return BROTLI_TRUE;
}